

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

vector<wasm::Name,_std::allocator<wasm::Name>_> * __thiscall
wasm::anon_unknown_18::FunctionSplitter::finish
          (vector<wasm::Name,_std::allocator<wasm::Name>_> *__return_storage_ptr__,
          FunctionSplitter *this)

{
  Module *this_00;
  bool bVar1;
  pair<std::__detail::_Node_iterator<wasm::Name,_true,_true>,_bool> pVar2;
  anon_class_8_1_ad61b575 local_d8;
  function<bool_(wasm::Function_*)> local_d0;
  _Node_iterator_base<wasm::Name,_true> local_b0;
  undefined1 local_a8;
  Function *local_90;
  Function *inlineable;
  type *split;
  type *func;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split>,_true>
  local_70;
  iterator __end2;
  iterator __begin2;
  unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split>_>_>
  *__range2;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  inlineableNames;
  FunctionSplitter *this_local;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *ret;
  
  inlineableNames._M_h._M_single_bucket._7_1_ = 0;
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector(__return_storage_ptr__);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&__range2);
  __end2 = std::
           unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split>_>_>
           ::begin(&this->splits);
  local_70._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split>_>_>
       ::end(&this->splits);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split>,_true>
                       ,&local_70);
    if (!bVar1) break;
    func = &std::__detail::
            _Node_iterator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split>,_false,_true>
            ::operator*(&__end2)->first;
    split = (type *)std::
                    get<0ul,wasm::Name_const,wasm::(anonymous_namespace)::FunctionSplitter::Split>
                              ((pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split>
                                *)func);
    inlineable = (Function *)
                 std::get<1ul,wasm::Name_const,wasm::(anonymous_namespace)::FunctionSplitter::Split>
                           ((pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split>
                             *)func);
    local_90 = (Function *)(inlineable->super_Importable).super_Named.name.super_IString.str._M_len;
    if (local_90 != (Function *)0x0) {
      pVar2 = std::
              unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
              ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                        *)&__range2,(value_type *)local_90);
      local_b0._M_cur =
           (__node_type *)pVar2.first.super__Node_iterator_base<wasm::Name,_true>._M_cur;
      local_a8 = pVar2.second;
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                (__return_storage_ptr__,(value_type *)split);
    }
    std::__detail::
    _Node_iterator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionSplitter::Split>,_false,_true>
    ::operator++(&__end2);
  }
  this_00 = this->module;
  local_d8.inlineableNames =
       (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
        *)&__range2;
  std::function<bool(wasm::Function*)>::
  function<wasm::(anonymous_namespace)::FunctionSplitter::finish()::_lambda(wasm::Function*)_1_,void>
            ((function<bool(wasm::Function*)> *)&local_d0,&local_d8);
  Module::removeFunctions(this_00,&local_d0);
  std::function<bool_(wasm::Function_*)>::~function(&local_d0);
  inlineableNames._M_h._M_single_bucket._7_1_ = 1;
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                    *)&__range2);
  if ((inlineableNames._M_h._M_single_bucket._7_1_ & 1) == 0) {
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Name> finish() {
    std::vector<Name> ret;
    std::unordered_set<Name> inlineableNames;
    for (auto& [func, split] : splits) {
      auto* inlineable = split.inlineable;
      if (inlineable) {
        inlineableNames.insert(inlineable->name);
        ret.push_back(func);
      }
    }
    module->removeFunctions([&](Function* func) {
      return inlineableNames.find(func->name) != inlineableNames.end();
    });
    return ret;
  }